

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

ParameterInfo * __thiscall
C3DFile::readParameterInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,ifstream *datastream)

{
  Sint8 *pSVar1;
  Uint8 *pUVar2;
  Uint8 **ppUVar3;
  char cVar4;
  byte bVar5;
  char *pcVar6;
  Uint8 *pUVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  
  __return_storage_ptr__->name_length = -1;
  __return_storage_ptr__->group_id = -1;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->next_offset = -1;
  __return_storage_ptr__->data_type = -1;
  __return_storage_ptr__->n_dimensions = 0xff;
  __return_storage_ptr__->dimensions = (Uint8 *)0x0;
  __return_storage_ptr__->char_data = (char *)0x0;
  __return_storage_ptr__->int_data = (Sint16 *)0x0;
  __return_storage_ptr__->float_data = (float *)0x0;
  __return_storage_ptr__->descr_length = -1;
  __return_storage_ptr__->description = (char *)0x0;
  __return_storage_ptr__->locked = false;
  std::istream::read((char *)datastream,(long)__return_storage_ptr__);
  if (__return_storage_ptr__->name != (char *)0x0) {
    __assert_fail("result.name == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xdc,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  cVar4 = __return_storage_ptr__->name_length;
  if (cVar4 < '\0') {
    __return_storage_ptr__->name_length = -cVar4;
  }
  __return_storage_ptr__->locked = cVar4 < '\0';
  pcVar6 = (char *)operator_new__((long)__return_storage_ptr__->name_length + 1);
  __return_storage_ptr__->name = pcVar6;
  std::istream::read((char *)datastream,(long)pcVar6);
  __return_storage_ptr__->name[__return_storage_ptr__->name_length] = '\0';
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->next_offset);
  pSVar1 = &__return_storage_ptr__->data_type;
  std::istream::read((char *)datastream,(long)pSVar1);
  pUVar2 = &__return_storage_ptr__->n_dimensions;
  std::istream::read((char *)datastream,(long)pUVar2);
  uVar10 = (ulong)*pUVar2;
  if (7 < uVar10) {
    __assert_fail("result.n_dimensions <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xed,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pUVar7 = (Uint8 *)operator_new__(uVar10);
  ppUVar3 = &__return_storage_ptr__->dimensions;
  *ppUVar3 = pUVar7;
  if (uVar10 == 0) {
    bVar5 = *pSVar1;
    if (bVar5 < 4) {
      if (bVar5 == 1) {
LAB_00108afa:
        pvVar8 = operator_new__(1);
        lVar9 = 0x20;
      }
      else {
        if (bVar5 != 2) goto LAB_00108b60;
        pvVar8 = operator_new__(2);
        lVar9 = 0x28;
      }
    }
    else {
      if (bVar5 != 4) {
        if (bVar5 != 0xff) goto LAB_00108b60;
        goto LAB_00108afa;
      }
      pvVar8 = operator_new__(4);
      lVar9 = 0x30;
    }
    *(void **)(&__return_storage_ptr__->name_length + lVar9) = pvVar8;
    std::istream::read((char *)datastream,(long)pvVar8);
    goto LAB_00108b60;
  }
  if (*pUVar2 == '\0') {
    uVar11 = 1;
  }
  else {
    uVar11 = 1;
    uVar10 = 0;
    do {
      std::istream::read((char *)datastream,(long)(*ppUVar3 + uVar10));
      uVar11 = uVar11 * (*ppUVar3)[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar10 < *pUVar2);
  }
  bVar5 = *pSVar1;
  if (bVar5 < 4) {
    if (bVar5 == 1) {
LAB_00108adc:
      pvVar8 = operator_new__((ulong)uVar11);
      lVar9 = 0x20;
    }
    else {
      if (bVar5 != 2) goto LAB_00108b60;
      pvVar8 = operator_new__((ulong)(uVar11 * 2));
      lVar9 = 0x28;
    }
  }
  else {
    if (bVar5 != 4) {
      if (bVar5 != 0xff) goto LAB_00108b60;
      goto LAB_00108adc;
    }
    pvVar8 = operator_new__((ulong)uVar11 << 2);
    lVar9 = 0x30;
  }
  *(void **)(&__return_storage_ptr__->name_length + lVar9) = pvVar8;
  std::istream::read((char *)datastream,(long)pvVar8);
LAB_00108b60:
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->descr_length);
  if (__return_storage_ptr__->description != (char *)0x0) {
    __assert_fail("result.description == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x117,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pcVar6 = (char *)operator_new__((long)__return_storage_ptr__->descr_length + 1);
  __return_storage_ptr__->description = pcVar6;
  std::istream::read((char *)datastream,(long)pcVar6);
  __return_storage_ptr__->description[__return_storage_ptr__->descr_length] = '\0';
  return __return_storage_ptr__;
}

Assistant:

ParameterInfo C3DFile::readParameterInfo (ifstream &datastream) {
	ParameterInfo result;
	datastream.read(reinterpret_cast<char *>(&result), sizeof(Sint8) * 2);
	
	assert(result.name == NULL);
	if (result.name_length < 0) {
		result.name_length *= -1;
		result.locked = true;
	} else {
		result.locked = false;
	}
	result.name = new char[result.name_length + 1];
	datastream.read(result.name, result.name_length);
	result.name[result.name_length] = 0;

	datastream.read(reinterpret_cast<char *>(&result.next_offset), sizeof(Sint16));
	datastream.read(reinterpret_cast<char *>(&result.data_type), sizeof(Uint8));
	datastream.read(reinterpret_cast<char *>(&result.n_dimensions), sizeof(Uint8));

	if (result.n_dimensions > 1) {
		// maximum of 7 dimensions (see c3d UG p. 50)
		assert (result.n_dimensions <= 7);
	}

	result.dimensions = new Uint8[result.n_dimensions];

	int i;

	if (result.n_dimensions == 0) {
		// if dim == 0 the data comes right away
		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[1];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char));
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[1];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16));
		} else if (result.data_type == 4) {
			result.float_data = new float[1];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float));
		}
	} else {
		// we first have to read out the dimensions of the values and then we can
		// store the values
		int count = 1;
		for (i = 0; i < result.n_dimensions; i++) {
			datastream.read(reinterpret_cast<char *>(&result.dimensions[i]), sizeof(Uint8));
			count *= result.dimensions[i];
		}

		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[count];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char) * count);
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[count];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16) * count);
		} else if (result.data_type == 4) {
			result.float_data = new float[count];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float) * count);
		}
	}

	datastream.read(reinterpret_cast<char *>(&result.descr_length), sizeof(Uint8));

	assert(result.description == NULL);
	result.description = new char[result.descr_length + 1];
	datastream.read(result.description, result.descr_length);
	result.description[result.descr_length] = 0;

	return result;
}